

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

void __thiscall InterpTest_HostTrap_Test::InterpTest_HostTrap_Test(InterpTest_HostTrap_Test *this)

{
  Features local_14;
  
  testing::Test::Test((Test *)this);
  (this->super_InterpTest).super_Test._vptr_Test = (_func_int **)&PTR__InterpTest_002bdc70;
  local_14.exceptions_enabled_ = false;
  local_14.mutable_globals_enabled_ = true;
  local_14.sat_float_to_int_enabled_ = false;
  local_14.sign_extension_enabled_ = false;
  local_14.simd_enabled_ = false;
  local_14.threads_enabled_ = false;
  local_14.multi_value_enabled_ = false;
  local_14.tail_call_enabled_ = false;
  local_14.bulk_memory_enabled_ = false;
  local_14.reference_types_enabled_ = false;
  local_14.annotations_enabled_ = false;
  local_14.gc_enabled_ = false;
  wabt::interp::Store::Store(&(this->super_InterpTest).store_,&local_14);
  memset(&(this->super_InterpTest).module_desc_,0,0x150);
  (this->super_InterpTest).super_Test._vptr_Test = (_func_int **)&PTR__InterpTest_002bd8c0;
  return;
}

Assistant:

TEST_F(InterpTest, HostTrap) {
  // (import "host" "a" (func $0))
  // (func $1 call $0)
  // (start $1)
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x04, 0x01,
      0x60, 0x00, 0x00, 0x02, 0x0a, 0x01, 0x04, 0x68, 0x6f, 0x73, 0x74,
      0x01, 0x61, 0x00, 0x00, 0x03, 0x02, 0x01, 0x00, 0x08, 0x01, 0x01,
      0x0a, 0x06, 0x01, 0x04, 0x00, 0x10, 0x00, 0x0b,
  });

  auto host_func = HostFunc::New(store_, FuncType{{}, {}},
                                 [&](const Values& params, Values& results,
                                     Trap::Ptr* out_trap) -> Result {
                                   *out_trap = Trap::New(store_, "boom");
                                   return Result::Error;
                                 });

  mod_ = Module::New(store_, module_desc_);
  RefPtr<Trap> trap;
  Instance::Instantiate(store_, mod_.ref(), {host_func->self()}, &trap);

  ASSERT_TRUE(trap);
  ASSERT_EQ("boom", trap->message());
}